

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

long ndiSignedToLong(char *cp,int n)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (*cp == '+') {
    lVar2 = 1;
  }
  else {
    if (*cp != '-') {
      return 0;
    }
    lVar2 = -1;
  }
  if (n < 2) {
    lVar1 = 0;
  }
  else {
    uVar3 = 1;
    lVar1 = 0;
    do {
      if (9 < (byte)(cp[uVar3] - 0x30U)) break;
      lVar1 = (ulong)((byte)cp[uVar3] & 0xf) + lVar1 * 10;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return lVar1 * lVar2;
}

Assistant:

ndicapiExport long ndiSignedToLong(const char* cp, int n)
{
  int i;
  int c;
  long result = 0;
  int sign = 1;

  c = cp[0];

  if (c == '+')
  {
    sign = 1;
  }
  else if (c == '-')
  {
    sign = -1;
  }
  else
  {
    return 0;
  }

  for (i = 1; i < n; i++)
  {
    c = cp[i];
    if (c >= '0' && c <= '9')
    {
      result = (result * 10) + (c - '0');
    }
    else
    {
      break;
    }
  }

  return sign * result;
}